

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<QtPromise::QPromiseUndefinedException>
          (PromiseError *this,QPromiseUndefinedException *value)

{
  void *__tmp;
  undefined8 *puVar1;
  
  (this->m_data)._M_exception_object = (void *)0x0;
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__QException_0012ab80;
  __cxa_throw(puVar1,&QtPromise::QPromiseUndefinedException::typeinfo,QException::~QException);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }